

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void increase_morale(tgestate_t *state,uint8_t delta)

{
  int increased_morale;
  uint8_t delta_local;
  tgestate_t *state_local;
  
  increased_morale = (uint)state->morale + (uint)delta;
  if (0x6f < (uint)increased_morale) {
    increased_morale = 0x70;
  }
  state->morale = (uint8_t)increased_morale;
  return;
}

Assistant:

void increase_morale(tgestate_t *state, uint8_t delta)
{
  int increased_morale;

  assert(state != NULL);
  assert(delta > 0);

  increased_morale = state->morale + delta;
  if (increased_morale >= morale_MAX)
    increased_morale = morale_MAX;

  assert(increased_morale >= morale_MIN);
  assert(increased_morale <= morale_MAX);

  state->morale = increased_morale;
}